

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O3

DdNode * Llb_Nonlin4Image(DdManager *dd,Vec_Ptr_t *vParts,DdNode *bCurrent,Vec_Int_t *vVars2Q)

{
  Llb_Prt_t **ppLVar1;
  Llb_Prt_t *pPart;
  int iVar2;
  int iVar3;
  Llb_Mgr_t_conflict *p;
  long lVar4;
  DdNode *n;
  long lVar5;
  long lVar6;
  DdNode *f;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  p = Llb_Nonlin4Alloc(dd,vParts,bCurrent,vVars2Q,0);
  iVar2 = p->iPartFree;
  if (0 < (long)iVar2) {
    ppLVar1 = p->pParts;
    lVar6 = 0;
    do {
      pPart = ppLVar1[lVar6];
      if (pPart != (Llb_Prt_t *)0x0) {
        lVar4 = (long)pPart->vVars->nSize;
        if (0 < lVar4) {
          lVar5 = 0;
          do {
            if (p->pVars[pPart->vVars->pArray[lVar5]]->vParts->nSize == 1) {
              Llb_Nonlin4Quantify1(p,pPart);
              break;
            }
            lVar5 = lVar5 + 1;
          } while (lVar4 != lVar5);
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar2);
  }
  Llb_Nonlin4RecomputeScores(p);
  iVar2 = Llb_Nonlin4NextPartitions(p,&local_38,&local_40);
  if (iVar2 != 0) {
    do {
      iVar2 = Cudd_ReadReorderings(dd);
      iVar3 = Llb_Nonlin4Quantify2(p,local_38,local_40);
      if (iVar3 == 0) {
        Llb_Nonlin4Free(p);
        return (DdNode *)0x0;
      }
      iVar3 = Cudd_ReadReorderings(dd);
      if (iVar2 < iVar3) {
        Llb_Nonlin4RecomputeScores(p);
      }
      iVar2 = Llb_Nonlin4NextPartitions(p,&local_38,&local_40);
    } while (iVar2 != 0);
  }
  n = Cudd_ReadOne(p->dd);
  Cudd_Ref(n);
  iVar2 = p->iPartFree;
  if (0 < iVar2) {
    lVar6 = 0;
    f = n;
    do {
      n = f;
      if (p->pParts[lVar6] != (Llb_Prt_t *)0x0) {
        n = Cudd_bddAnd(p->dd,f,p->pParts[lVar6]->bFunc);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,f);
        iVar2 = p->iPartFree;
      }
      lVar6 = lVar6 + 1;
      f = n;
    } while (lVar6 < iVar2);
  }
  Llb_Nonlin4Free(p);
  Cudd_Deref(n);
  return n;
}

Assistant:

DdNode * Llb_Nonlin4Image( DdManager * dd, Vec_Ptr_t * vParts, DdNode * bCurrent, Vec_Int_t * vVars2Q )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders;
    // start the manager
    p = Llb_Nonlin4Alloc( dd, vParts, bCurrent, vVars2Q, 0 );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_Nonlin4HasSingletonVars(p, pPart) )
            Llb_Nonlin4Quantify1( p, pPart );
    // compute scores
    Llb_Nonlin4RecomputeScores( p );
    // iteratively quantify variables
    while ( Llb_Nonlin4NextPartitions(p, &pPart1, &pPart2) )
    {
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_Nonlin4Quantify2( p, pPart1, pPart2 ) )
        {
            Llb_Nonlin4Free( p );
            return NULL;
        }
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_Nonlin4RecomputeScores( p );
//        else
//            Llb_Nonlin4VerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
//    nSuppMax = p->nSuppMax;
    Llb_Nonlin4Free( p );
//printf( "\n" );
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}